

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O3

VRle __thiscall VRle::operator&(VRle *this,VRle *o)

{
  model *pmVar1;
  Data *this_00;
  vector<VRle::Span,_std::allocator<VRle::Span>_> *this_01;
  Span *__n;
  long *in_RDX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int __fd;
  undefined **this_02;
  VRle *this_03;
  View a;
  View b;
  pointer pSVar2;
  
  pmVar1 = (o->d).mModel;
  if (((pmVar1->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (pmVar1->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
       super__Vector_impl_data._M_finish) || (*(long *)(*in_RDX + 8) == *(long *)(*in_RDX + 0x10)))
  {
    (this->d).mModel = (model *)0x0;
    vcow_ptr<VRle::Data>::vcow_ptr(&this->d);
  }
  else {
    this_02 = &PTR_00144f70;
    this_00 = (Data *)__tls_get_addr();
    if (*(char *)&this_00[1].mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                  _M_impl.super__Vector_impl_data._M_start == '\0') {
      operator&((VRle *)this_02);
    }
    pSVar2 = (this_00->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this_00->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
        super__Vector_impl_data._M_finish != pSVar2) {
      (this_00->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
      super__Vector_impl_data._M_finish = pSVar2;
    }
    *(undefined8 *)((long)&(this_00->mBbox).x1 + 1) = 0;
    *(undefined8 *)((long)&(this_00->mBbox).x2 + 1) = 0;
    (this_00->mOffset).mx = 0;
    (this_00->mOffset).my = 0;
    (this_00->mBbox).x1 = 0;
    (this_00->mBbox).y1 = 0;
    if (*(char *)&this_00[1].mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                  _M_impl.super__Vector_impl_data._M_start == '\0') {
      operator&((VRle *)this_02);
    }
    pmVar1 = (o->d).mModel;
    pSVar2 = (pmVar1->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
             _M_impl.super__Vector_impl_data._M_start;
    a._size = (long)(pmVar1->mValue).mSpans.
                    super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pSVar2 >> 3;
    __n = *(Span **)(*in_RDX + 8);
    b._size = *(long *)(*in_RDX + 0x10) - (long)__n >> 3;
    a._data = pSVar2;
    b._data = __n;
    Data::opIntersect(this_00,a,b);
    __fd = (int)pSVar2;
    this_03 = this;
    vcow_ptr<VRle::Data>::vcow_ptr(&this->d);
    __buf = extraout_RDX;
    if (*(char *)&this_00[1].mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                  _M_impl.super__Vector_impl_data._M_start == '\0') {
      operator&(this_03);
      __buf = extraout_RDX_00;
    }
    this_01 = (vector<VRle::Span,_std::allocator<VRle::Span>_> *)
              vcow_ptr<VRle::Data>::write(&this->d,__fd,__buf,(size_t)__n);
    std::vector<VRle::Span,_std::allocator<VRle::Span>_>::operator=
              (this_01,(vector<VRle::Span,_std::allocator<VRle::Span>_> *)this_00);
    *(VPoint *)(this_01 + 1) = this_00->mOffset;
    pSVar2 = *(pointer *)&(this_00->mBbox).x2;
    this_01[1].super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
    super__Vector_impl_data._M_finish = *(pointer *)&this_00->mBbox;
    this_01[1].super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pSVar2;
    *(bool *)&this_01[2].super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
              super__Vector_impl_data._M_start = this_00->mBboxDirty;
  }
  return (VRle)(vcow_ptr<VRle::Data>)this;
}

Assistant:

VRle VRle::operator&(const VRle &o) const
{
    if (empty() || o.empty()) return {};

    Scratch_Object.reset();
    Scratch_Object.opIntersect(d.read().view(), o.d.read().view());

    VRle result;
    result.d.write() = Scratch_Object;

    return result;
}